

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_zeta_compact
          (ChElementHexaANCF_3843 *this,VectorN *Sxi_zeta_compact,double xi,double eta,double zeta)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar24 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  auVar27._8_56_ = in_register_00001288;
  auVar27._0_8_ = zeta;
  auVar25._8_56_ = in_register_00001248;
  auVar25._0_8_ = eta;
  auVar24._8_56_ = in_register_00001208;
  auVar24._0_8_ = xi;
  auVar20 = auVar25._0_16_;
  auVar13 = vfmadd213sd_fma(auVar20,auVar20,auVar20);
  auVar11 = ZEXT816(0x4008000000000000);
  auVar21 = auVar24._0_16_;
  auVar13 = vfmadd231sd_fma(auVar13,auVar21,auVar21);
  auVar26 = auVar27._0_16_;
  auVar8 = vmulsd_avx512f(auVar26,auVar11);
  dVar2 = xi + -1.0;
  dVar3 = eta + -1.0;
  dVar4 = xi + 1.0;
  auVar9 = vfmadd213sd_avx512f(auVar11,auVar26,ZEXT816(0x3ff0000000000000));
  auVar10 = vaddsd_avx512f(auVar26,ZEXT816(0xbff0000000000000));
  auVar7 = vfmadd213sd_fma(auVar11,auVar26,ZEXT816(0xbff0000000000000));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar13._0_8_ + xi;
  auVar11 = vfmadd231sd_avx512f(auVar18,auVar8,auVar26);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2;
  auVar12 = vmulsd_avx512f(auVar16,ZEXT816(0x3fb0000000000000));
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar13._0_8_ - xi;
  auVar13 = vfmadd231sd_avx512f(auVar34,auVar8,auVar26);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4;
  auVar14 = vmulsd_avx512f(auVar19,ZEXT816(0xbfb0000000000000));
  auVar15 = vmulsd_avx512f(auVar19,ZEXT816(0x3fb0000000000000));
  auVar16 = vmulsd_avx512f(auVar16,ZEXT816(0xbfb0000000000000));
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3;
  auVar17 = vmulsd_avx512f(auVar14,auVar29);
  auVar18 = vaddsd_avx512f(auVar11,ZEXT816(0xc008000000000000));
  auVar19 = vaddsd_avx512f(auVar13,ZEXT816(0xc008000000000000));
  auVar11 = vmulsd_avx512f(auVar17,auVar19);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0] = auVar18._0_8_ * auVar12._0_8_ * dVar3;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[1] = dVar3 * dVar2 * dVar2 * dVar4 * this->m_lenX * 0.03125;
  dVar5 = eta + 1.0;
  auVar13 = vfmsub213sd_fma(auVar20,auVar20,auVar20);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5;
  auVar17 = vmulsd_avx512f(auVar15,auVar23);
  auVar20 = vmulsd_avx512f(auVar16,auVar23);
  auVar13 = vfmadd231sd_fma(auVar13,auVar21,auVar21);
  auVar21 = vsubsd_avx512f(auVar13,auVar21);
  auVar21 = vfmadd231sd_avx512f(auVar21,auVar8,auVar26);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar13._0_8_ + xi;
  auVar13 = vfmadd231sd_avx512f(auVar22,auVar26,auVar8);
  auVar22 = vaddsd_avx512f(auVar21,ZEXT816(0xc008000000000000));
  auVar23 = vaddsd_avx512f(auVar13,ZEXT816(0xc008000000000000));
  auVar17 = vmulsd_avx512f(auVar17,auVar22);
  auVar21 = vmulsd_avx512f(auVar20,auVar23);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[2] = this->m_lenY * 0.03125 * dVar5 * dVar3 * dVar3 * dVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = this->m_lenZ * 0.03125;
  auVar13 = vmulsd_avx512f(auVar9,auVar35);
  auVar13 = vmulsd_avx512f(auVar10,auVar13);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[3] = auVar13._0_8_ * dVar2 * dVar3;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[4] = auVar11._0_8_;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[5] = dVar4 * dVar4 * this->m_lenX * 0.03125 * dVar2 * dVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->m_lenY;
  auVar13 = vmulsd_avx512f(ZEXT816(0xbfa0000000000000),auVar13);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar5;
  auVar13 = vmulsd_avx512f(auVar32,auVar13);
  auVar13 = vmulsd_avx512f(auVar29,auVar13);
  auVar13 = vmulsd_avx512f(auVar29,auVar13);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar4;
  auVar13 = vmulsd_avx512f(auVar33,auVar13);
  pdVar1 = (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 6;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->m_lenZ;
  auVar13 = vmulsd_avx512f(ZEXT816(0xbfa0000000000000),auVar8);
  auVar13 = vmulsd_avx512f(auVar9,auVar13);
  auVar13 = vmulsd_avx512f(auVar10,auVar13);
  auVar13 = vmulsd_avx512f(auVar33,auVar13);
  auVar13 = vmulsd_avx512f(auVar29,auVar13);
  pdVar1 = (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  pdVar1 = (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 8;
  vmovsd_avx512f(auVar17);
  *pdVar1 = *pdVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this->m_lenX;
  auVar8 = ZEXT816(0xbfa0000000000000);
  auVar13 = vmulsd_avx512f(auVar8,auVar11);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2;
  auVar13 = vmulsd_avx512f(auVar28,auVar13);
  auVar13 = vmulsd_avx512f(auVar33,auVar13);
  auVar13 = vmulsd_avx512f(auVar33,auVar13);
  auVar13 = vmulsd_avx512f(auVar32,auVar13);
  pdVar1 = (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 9;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->m_lenY;
  auVar13 = vmulsd_avx512f(auVar8,auVar17);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar3;
  auVar13 = vmulsd_avx512f(auVar30,auVar13);
  auVar13 = vmulsd_avx512f(auVar32,auVar13);
  auVar13 = vmulsd_avx512f(auVar32,auVar13);
  auVar13 = vmulsd_avx512f(auVar33,auVar13);
  pdVar1 = (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 10;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = this->m_lenZ;
  auVar13 = vmulsd_avx512f(ZEXT816(0x3fa0000000000000),auVar20);
  auVar13 = vmulsd_avx512f(auVar9,auVar13);
  auVar13 = vmulsd_avx512f(auVar10,auVar13);
  auVar13 = vmulsd_avx512f(auVar33,auVar13);
  auVar13 = vmulsd_avx512f(auVar32,auVar13);
  pdVar1 = (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 0xb;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0xc] = auVar21._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = this->m_lenX;
  auVar13 = vmulsd_avx512f(auVar8,auVar21);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0xd] = dVar5 * dVar2 * dVar2 * dVar4 * auVar13._0_8_;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0xe] = dVar2 * dVar5 * dVar5 * dVar3 * this->m_lenY * 0.03125;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = this->m_lenZ;
  auVar13 = vmulsd_avx512f(auVar8,auVar26);
  auVar13 = vmulsd_avx512f(auVar9,auVar13);
  auVar13 = vmulsd_avx512f(auVar10,auVar13);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0xf] = dVar5 * dVar2 * auVar13._0_8_;
  auVar13 = vmulsd_avx512f(auVar16,auVar30);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x10] = auVar18._0_8_ * auVar13._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->m_lenX;
  auVar8 = ZEXT816(0xbfa0000000000000);
  auVar13 = vmulsd_avx512f(auVar8,auVar9);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x11] = dVar3 * dVar2 * dVar2 * dVar4 * auVar13._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->m_lenY;
  auVar13 = vmulsd_avx512f(auVar8,auVar10);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x12] = dVar2 * dVar3 * dVar3 * dVar5 * auVar13._0_8_;
  dVar6 = zeta + 1.0;
  dVar31 = auVar7._0_8_;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x13] = dVar3 * dVar2 * this->m_lenZ * 0.03125 * dVar6 * dVar31;
  auVar13 = vmulsd_avx512f(auVar15,auVar30);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x14] = auVar19._0_8_ * auVar13._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->m_lenX;
  auVar13 = vmulsd_avx512f(auVar8,auVar7);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x15] = dVar3 * dVar4 * dVar4 * dVar2 * auVar13._0_8_;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x16] = dVar4 * dVar3 * dVar3 * dVar5 * this->m_lenY * 0.03125;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = this->m_lenZ;
  auVar13 = vmulsd_avx512f(auVar8,auVar15);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x17] = dVar3 * dVar4 * dVar31 * dVar6 * auVar13._0_8_;
  auVar13 = vmulsd_avx512f(auVar14,auVar32);
  auVar13 = vmulsd_avx512f(auVar13,auVar22);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x18] = auVar13._0_8_;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x19] = dVar5 * dVar4 * dVar4 * dVar2 * this->m_lenX * 0.03125;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x1a] = dVar4 * dVar5 * dVar5 * dVar3 * this->m_lenY * 0.03125;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x1b] = dVar5 * dVar4 * dVar31 * dVar6 * this->m_lenZ * 0.03125;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x1c] = auVar12._0_8_ * dVar5 * auVar23._0_8_;
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x1d] = dVar5 * dVar2 * dVar2 * dVar4 * this->m_lenX * 0.03125;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->m_lenY;
  auVar13 = vmulsd_avx512f(auVar8,auVar12);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x1e] = dVar2 * dVar5 * dVar5 * dVar3 * auVar13._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = this->m_lenZ;
  auVar13 = vmulsd_avx512f(auVar8,auVar14);
  (Sxi_zeta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.
  m_data.array[0x1f] = dVar5 * dVar2 * dVar31 * dVar6 * auVar13._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_zeta_compact(VectorN& Sxi_zeta_compact, double xi, double eta, double zeta) {
    Sxi_zeta_compact(0) = 0.0625 * (xi - 1) * (eta - 1) * (eta * eta + eta + xi * xi + xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(1) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (eta - 1);
    Sxi_zeta_compact(2) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (xi - 1);
    Sxi_zeta_compact(3) = 0.03125 * m_lenZ * (3 * zeta + 1) * (zeta - 1) * (xi - 1) * (eta - 1);
    Sxi_zeta_compact(4) = -0.0625 * (xi + 1) * (eta - 1) * (eta * eta + eta + xi * xi - xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(5) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (eta - 1);
    Sxi_zeta_compact(6) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (xi + 1);
    Sxi_zeta_compact(7) = -0.03125 * m_lenZ * (3 * zeta + 1) * (zeta - 1) * (xi + 1) * (eta - 1);
    Sxi_zeta_compact(8) = 0.0625 * (xi + 1) * (eta + 1) * (eta * eta - eta + xi * xi - xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(9) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (eta + 1);
    Sxi_zeta_compact(10) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (xi + 1);
    Sxi_zeta_compact(11) = 0.03125 * m_lenZ * (3 * zeta + 1) * (zeta - 1) * (xi + 1) * (eta + 1);
    Sxi_zeta_compact(12) = -0.0625 * (xi - 1) * (eta + 1) * (eta * eta - eta + xi * xi + xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(13) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (eta + 1);
    Sxi_zeta_compact(14) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (xi - 1);
    Sxi_zeta_compact(15) = -0.03125 * m_lenZ * (3 * zeta + 1) * (zeta - 1) * (xi - 1) * (eta + 1);
    Sxi_zeta_compact(16) = -0.0625 * (xi - 1) * (eta - 1) * (eta * eta + eta + xi * xi + xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(17) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (eta - 1);
    Sxi_zeta_compact(18) = -0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (xi - 1);
    Sxi_zeta_compact(19) = 0.03125 * m_lenZ * (zeta + 1) * (3 * zeta - 1) * (xi - 1) * (eta - 1);
    Sxi_zeta_compact(20) = 0.0625 * (xi + 1) * (eta - 1) * (eta * eta + eta + xi * xi - xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(21) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (eta - 1);
    Sxi_zeta_compact(22) = 0.03125 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1) * (xi + 1);
    Sxi_zeta_compact(23) = -0.03125 * m_lenZ * (zeta + 1) * (3 * zeta - 1) * (xi + 1) * (eta - 1);
    Sxi_zeta_compact(24) = -0.0625 * (xi + 1) * (eta + 1) * (eta * eta - eta + xi * xi - xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(25) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (eta + 1);
    Sxi_zeta_compact(26) = 0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (xi + 1);
    Sxi_zeta_compact(27) = 0.03125 * m_lenZ * (zeta + 1) * (3 * zeta - 1) * (xi + 1) * (eta + 1);
    Sxi_zeta_compact(28) = 0.0625 * (xi - 1) * (eta + 1) * (eta * eta - eta + xi * xi + xi + 3 * zeta * zeta - 3);
    Sxi_zeta_compact(29) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (eta + 1);
    Sxi_zeta_compact(30) = -0.03125 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1) * (xi - 1);
    Sxi_zeta_compact(31) = -0.03125 * m_lenZ * (zeta + 1) * (3 * zeta - 1) * (xi - 1) * (eta + 1);
}